

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::enterInitializingMode(Federate *this)

{
  Modes MVar1;
  element_type *peVar2;
  int iVar3;
  InvalidFunctionCall *this_00;
  string_view message;
  
  MVar1 = (this->currentMode)._M_i;
  if (MVar1 == PENDING_INIT) {
    enterInitializingModeComplete(this);
    return;
  }
  if (MVar1 != INITIALIZING) {
    if (MVar1 != STARTUP) {
      this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      message._M_str = "cannot transition from current mode to initializing mode";
      message._M_len = 0x38;
      InvalidFunctionCall::InvalidFunctionCall(this_00,message);
      __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
    }
    if (this->hasPotentialInterfaces == true) {
      potentialInterfacesStartupSequence(this);
    }
    peVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar2->_vptr_Core[0x13])(peVar2,(ulong)(uint)(this->fedID).fid,0);
    if ((char)iVar3 != '\0') {
      enteringInitializingMode(this,NEXT_STEP);
    }
  }
  return;
}

Assistant:

void Federate::enterInitializingMode()
{
    auto cmode = currentMode.load();
    switch (cmode) {
        case Modes::STARTUP:
            try {
                if (hasPotentialInterfaces) {
                    potentialInterfacesStartupSequence();
                }

                if (coreObject->enterInitializingMode(fedID)) {
                    enteringInitializingMode(IterationResult::NEXT_STEP);
                }
            }
            catch (const HelicsException&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            break;
        case Modes::PENDING_INIT:
            enterInitializingModeComplete();
            break;
        case Modes::INITIALIZING:
            break;
        default:
            throw(InvalidFunctionCall("cannot transition from current mode to initializing mode"));
    }
}